

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

json __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
          (Interpreter *this,Tree *tree)

{
  json_value extraout_RDX;
  Tree *in_RDI;
  json jVar1;
  ostringstream jsonStream;
  Tree *t;
  as_json *in_stack_fffffffffffffe00;
  as_json *in_stack_fffffffffffffe08;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffe10;
  string local_1e0 [80];
  ostringstream local_190 [143];
  undefined1 in_stack_fffffffffffffeff;
  parser_callback_t *in_stack_ffffffffffffff00;
  input_adapter *in_stack_ffffffffffffff08;
  
  t = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  c4::yml::as_json::as_json(in_stack_fffffffffffffe00,t);
  c4::yml::operator<<(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::ostringstream::str();
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)in_stack_fffffffffffffe00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              *)in_RDI,&stack0xfffffffffffffe00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               *)0x2e54bc);
  nlohmann::detail::input_adapter::~input_adapter((input_adapter *)0x2e54c6);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  jVar1.m_value.object = extraout_RDX.object;
  jVar1._0_8_ = t;
  return jVar1;
}

Assistant:

const json yamlTreeToJson(const ryml::Tree& tree) {
        std::ostringstream jsonStream;
        jsonStream << ryml::as_json(tree);
        return json::parse(jsonStream.str());
    }